

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_iterator_suite.cpp
# Opt level: O0

void concept_const_suite::random_access_iterator_addition(void)

{
  initializer_list<int> __l;
  iterator begin;
  iterator end;
  size_type length;
  const_iterator __first;
  undefined4 local_14c;
  view_pointer local_148;
  view_pointer pcStack_140;
  const_iterator local_130;
  difference_type local_120 [2];
  const_iterator local_110;
  undefined1 auStack_100 [8];
  const_iterator b;
  difference_type local_c0 [2];
  const_iterator local_b0;
  undefined1 auStack_a0 [8];
  const_iterator a;
  undefined1 local_78 [8];
  circular_view<int,_18446744073709551615UL> span;
  allocator<int> local_41;
  int local_40 [4];
  iterator local_30;
  size_type local_28;
  undefined1 local_20 [8];
  vector<int,_std::allocator<int>_> data;
  
  local_40[0] = 0xb;
  local_40[1] = 0x16;
  local_40[2] = 0x21;
  local_40[3] = 0x2c;
  local_30 = local_40;
  local_28 = 4;
  std::allocator<int>::allocator(&local_41);
  __l._M_len = local_28;
  __l._M_array = local_30;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_20,__l,&local_41);
  std::allocator<int>::~allocator(&local_41);
  begin = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_20);
  end = std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)local_20);
  a.current = (size_type)
              std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_20);
  length = std::vector<int,_std::allocator<int>_>::size
                     ((vector<int,_std::allocator<int>_> *)local_20);
  vista::circular_view<int,18446744073709551615ul>::
  circular_view<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((circular_view<int,18446744073709551615ul> *)local_78,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)begin._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)end._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)a.current,length);
  local_b0 = vista::circular_view<int,_18446744073709551615UL>::begin
                       ((circular_view<int,_18446744073709551615UL> *)local_78);
  _auStack_a0 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::
                operator+(&local_b0,2);
  __first = vista::circular_view<int,_18446744073709551615UL>::begin
                      ((circular_view<int,_18446744073709551615UL> *)local_78);
  local_c0[0] = std::
                distance<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int_const>>
                          (__first,_auStack_a0);
  b.current._4_4_ = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(span.begin(), a)","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x1e2,"void concept_const_suite::random_access_iterator_addition()",local_c0,
             (undefined1 *)((long)&b.current + 4));
  local_110 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_78);
  _auStack_100 = vista::operator+(2,&local_110);
  local_130 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_78);
  local_148 = (view_pointer)auStack_100;
  pcStack_140 = b.parent;
  local_120[0] = std::
                 distance<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int_const>>
                           (local_130,_auStack_100);
  local_14c = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(span.begin(), b)","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x1e5,"void concept_const_suite::random_access_iterator_addition()",local_120,
             &local_14c);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_20);
  return;
}

Assistant:

void random_access_iterator_addition()
{
    // a + n
    std::vector<int> data = { 11, 22, 33, 44 };
    const circular_view<int> span(data.begin(), data.end(), data.begin(), data.size());
    circular_view<int>::const_iterator a = span.begin() + 2;
    BOOST_TEST_EQ(std::distance(span.begin(), a), 2);
    // n + a
    circular_view<int>::const_iterator b = 2 + span.begin();
    BOOST_TEST_EQ(std::distance(span.begin(), b), 2);
}